

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O2

void test_skip(void)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 uVar5;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar6;
  
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  uVar2 = bson_bcon_magic();
  uVar2 = bcon_new(0,"hello","world","foo","{","bar",uVar2,CONCAT44(uVar5,0xf),CONCAT44(uVar6,10),
                   "}",0);
  uVar3 = bson_bcone_magic();
  uVar6 = 0;
  uVar5 = 0;
  cVar1 = bcon_extract(uVar2,"hello",uVar3,0x1c,2,"foo","{","bar",uVar3,0x1c,0x10,"}",0);
  if (cVar1 == '\0') {
    pcVar4 = 
    "BCON_EXTRACT (bcon, \"hello\", BCONE_SKIP (BSON_TYPE_UTF8), \"foo\", \"{\", \"bar\", BCONE_SKIP (BSON_TYPE_INT32), \"}\")"
    ;
    uVar2 = 0x1c5;
  }
  else {
    cVar1 = bcon_extract(uVar2,"hello",uVar3,0x1c,2,"foo","{","bar",uVar3,CONCAT44(uVar5,0x1c),
                         CONCAT44(uVar6,0x12),"}",0);
    if (cVar1 == '\0') {
      bson_destroy(uVar2);
      return;
    }
    pcVar4 = 
    "!BCON_EXTRACT (bcon, \"hello\", BCONE_SKIP (BSON_TYPE_UTF8), \"foo\", \"{\", \"bar\", BCONE_SKIP (BSON_TYPE_INT64), \"}\")"
    ;
    uVar2 = 0x1ce;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
          ,uVar2,"test_skip",pcVar4);
  abort();
}

Assistant:

static void
test_skip (void)
{
   bson_t *bcon =
      BCON_NEW ("hello", "world", "foo", "{", "bar", BCON_INT32 (10), "}");

   BSON_ASSERT (BCON_EXTRACT (bcon,
                         "hello",
                         BCONE_SKIP (BSON_TYPE_UTF8),
                         "foo",
                         "{",
                         "bar",
                         BCONE_SKIP (BSON_TYPE_INT32),
                         "}"));

   BSON_ASSERT (!BCON_EXTRACT (bcon,
                          "hello",
                          BCONE_SKIP (BSON_TYPE_UTF8),
                          "foo",
                          "{",
                          "bar",
                          BCONE_SKIP (BSON_TYPE_INT64),
                          "}"));

   bson_destroy (bcon);
}